

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int kex_agree_hostkey(LIBSSH2_SESSION *session,unsigned_long kex_flags,uchar *hostkey,
                     unsigned_long hostkey_len)

{
  LIBSSH2_HOSTKEY_METHOD **methodlist;
  char *pcVar1;
  uchar *puVar2;
  LIBSSH2_HOSTKEY_METHOD *pLVar3;
  uchar *puVar4;
  size_t sVar5;
  
  methodlist = libssh2_hostkey_methods();
  puVar4 = (uchar *)session->hostkey_prefs;
  if (puVar4 == (uchar *)0x0) {
    if (methodlist != (LIBSSH2_HOSTKEY_METHOD **)0x0) {
      pLVar3 = *methodlist;
      while (pLVar3 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
        methodlist = methodlist + 1;
        puVar4 = (uchar *)pLVar3->name;
        if (puVar4 == (uchar *)0x0) {
          return -1;
        }
        sVar5 = strlen((char *)puVar4);
        puVar4 = kex_agree_instr(hostkey,hostkey_len,puVar4,sVar5);
        if (((puVar4 != (uchar *)0x0) &&
            (((kex_flags & 1) == 0 ||
             (pLVar3->encrypt !=
              (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_void_ptr_ptr
               *)0x0)))) &&
           (((kex_flags & 2) == 0 ||
            (pLVar3->sig_verify !=
             (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_size_t_uchar_ptr_size_t_void_ptr_ptr *)0x0))))
        goto LAB_00121283;
        pLVar3 = *methodlist;
      }
    }
  }
  else {
    do {
      if (*puVar4 == '\0') {
        return -1;
      }
      pcVar1 = strchr((char *)puVar4,0x2c);
      if (pcVar1 == (char *)0x0) {
        sVar5 = strlen((char *)puVar4);
      }
      else {
        sVar5 = (long)pcVar1 - (long)puVar4;
      }
      puVar2 = kex_agree_instr(hostkey,hostkey_len,puVar4,sVar5);
      if (puVar2 != (uchar *)0x0) {
        pLVar3 = (LIBSSH2_HOSTKEY_METHOD *)
                 kex_get_method_by_name((char *)puVar4,sVar5,(LIBSSH2_COMMON_METHOD **)methodlist);
        if (pLVar3 == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
          return -1;
        }
        if ((((kex_flags & 1) == 0) ||
            (pLVar3->encrypt !=
             (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_void_ptr_ptr *
             )0x0)) &&
           (((kex_flags & 2) == 0 ||
            (pLVar3->sig_verify !=
             (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_size_t_uchar_ptr_size_t_void_ptr_ptr *)0x0))))
        {
LAB_00121283:
          session->hostkey = pLVar3;
          return 0;
        }
      }
      puVar4 = (uchar *)(pcVar1 + 1);
    } while (pcVar1 != (char *)0x0);
  }
  return -1;
}

Assistant:

static int kex_agree_hostkey(LIBSSH2_SESSION * session,
                             unsigned long kex_flags,
                             unsigned char *hostkey, unsigned long hostkey_len)
{
    const LIBSSH2_HOSTKEY_METHOD **hostkeyp = libssh2_hostkey_methods();
    unsigned char *s;

    if (session->hostkey_prefs) {
        s = (unsigned char *) session->hostkey_prefs;

        while (s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));
            if (kex_agree_instr(hostkey, hostkey_len, s, method_len)) {
                const LIBSSH2_HOSTKEY_METHOD *method =
                    (const LIBSSH2_HOSTKEY_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           hostkeyp);

                if (!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                /* So far so good, but does it suit our purposes? (Encrypting
                   vs Signing) */
                if (((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_ENC_HOSTKEY) ==
                     0) || (method->encrypt)) {
                    /* Either this hostkey can do encryption or this kex just
                       doesn't require it */
                    if (((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_SIGN_HOSTKEY)
                         == 0) || (method->sig_verify)) {
                        /* Either this hostkey can do signing or this kex just
                           doesn't require it */
                        session->hostkey = method;
                        return 0;
                    }
                }
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while (hostkeyp && (*hostkeyp) && (*hostkeyp)->name) {
        s = kex_agree_instr(hostkey, hostkey_len,
                            (unsigned char *) (*hostkeyp)->name,
                            strlen((*hostkeyp)->name));
        if (s) {
            /* So far so good, but does it suit our purposes? (Encrypting vs
               Signing) */
            if (((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_ENC_HOSTKEY) == 0) ||
                ((*hostkeyp)->encrypt)) {
                /* Either this hostkey can do encryption or this kex just
                   doesn't require it */
                if (((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_SIGN_HOSTKEY) ==
                     0) || ((*hostkeyp)->sig_verify)) {
                    /* Either this hostkey can do signing or this kex just
                       doesn't require it */
                    session->hostkey = *hostkeyp;
                    return 0;
                }
            }
        }
        hostkeyp++;
    }

    return -1;
}